

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O3

bool __thiscall QXmlUtils::isNCName(QXmlUtils *this,QStringView ncName)

{
  QChar QVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  
  if (this == (QXmlUtils *)0x0) {
    return false;
  }
  QVar1.ucs = *(char16_t *)ncName.m_size;
  bVar2 = isLetter(QVar1);
  if (((bVar2) || (QVar1.ucs == L'_')) || (QVar1.ucs == L':')) {
    lVar4 = 0;
    do {
      QVar1.ucs = *(char16_t *)((long)ncName.m_size + lVar4);
      bVar2 = isNameChar(QVar1);
      bVar3 = QVar1.ucs != L':' && bVar2;
      if (QVar1.ucs == L':' || !bVar2) {
        return bVar3;
      }
      bVar2 = (long)this * 2 + -2 != lVar4;
      lVar4 = lVar4 + 2;
    } while (bVar2);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

[[nodiscard]] constexpr bool empty() const noexcept { return size() == 0; }